

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool __thiscall
aim_t::AimTraverse3DFloors
          (aim_t *this,divline_t *trace,intercept_t *in,int frontflag,int *planestocheck)

{
  double dVar1;
  line_t *plVar2;
  sector_t *psVar3;
  extsector_t *peVar4;
  F3DFloor *pFVar5;
  secplane_t *psVar6;
  secplane_t *psVar7;
  sector_t **ppsVar8;
  int iVar9;
  int iVar10;
  uint k;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double x;
  double dVar16;
  double dVar17;
  secplane_t *local_a8;
  secplane_t *local_a0;
  
  plVar2 = (in->d).line;
  *planestocheck = this->aimdir;
  if (plVar2->backsector != (sector_t *)0x0) {
    if (((plVar2->frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0)
       && ((plVar2->backsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0))
    {
      local_a0 = (secplane_t *)0x0;
      local_a8 = (secplane_t *)0x0;
    }
    else {
      dVar17 = in->frac;
      x = dVar17 * this->attackrange;
      dVar16 = dVar17 * trace->dx + trace->x;
      dVar17 = dVar17 * trace->dy + trace->y;
      local_a0 = (secplane_t *)0x0;
      local_a8 = (secplane_t *)0x0;
      for (iVar9 = 1; iVar9 != 3; iVar9 = iVar9 + 1) {
        ppsVar8 = &plVar2->backsector;
        if (iVar9 == 1) {
          ppsVar8 = &plVar2->frontsector;
        }
        psVar3 = *ppsVar8;
        iVar10 = iVar9 + -1;
        for (uVar11 = 0; peVar4 = psVar3->e,
            uVar11 < (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
            uVar11 = uVar11 + 1) {
          this->crossedffloors = true;
          pFVar5 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar11];
          if ((pFVar5->flags & 0x4000001) == 1) {
            psVar6 = (pFVar5->bottom).plane;
            dVar14 = (psVar6->normal).X;
            dVar15 = psVar6->D;
            psVar7 = (pFVar5->top).plane;
            dVar13 = (psVar6->normal).Y;
            dVar1 = psVar6->negiC;
            dVar12 = c_atan2(((psVar7->normal).Y * dVar17 + psVar7->D + (psVar7->normal).X * dVar16)
                             * psVar7->negiC - this->shootz,x);
            dVar12 = dVar12 * -57.29577951308232;
            dVar13 = c_atan2((dVar13 * dVar17 + dVar14 * dVar16 + dVar15) * dVar1 - this->shootz,x);
            dVar13 = dVar13 * -57.29577951308232;
            dVar14 = (this->toppitch).Degrees;
            dVar15 = (this->bottompitch).Degrees;
            if (dVar12 <= dVar14) {
              if (dVar15 <= dVar13) {
                return false;
              }
              if ((dVar13 <= dVar14) ||
                 ((this->toppitch).Degrees = dVar13, dVar14 = dVar13, iVar10 == frontflag))
              goto LAB_004b5f3f;
              local_a8 = (pFVar5->bottom).plane;
              *planestocheck = *planestocheck & 0xfffffffe;
            }
            else if (((dVar13 < dVar15) || (dVar15 <= dVar12)) ||
                    ((this->bottompitch).Degrees = dVar12, dVar15 = dVar12, iVar10 == frontflag)) {
LAB_004b5f3f:
              if ((iVar10 == frontflag) && (psVar3 == this->lastsector)) {
                dVar14 = (this->toppitch).Degrees;
                if (((pFVar5->bottom).plane == this->lastceilingplane) && (dVar14 < dVar13)) {
                  (this->toppitch).Degrees = dVar13;
                  dVar14 = dVar13;
                }
                dVar15 = (this->bottompitch).Degrees;
                if (((pFVar5->top).plane == this->lastfloorplane) && (dVar12 < dVar15)) {
                  (this->bottompitch).Degrees = dVar12;
                  dVar15 = dVar12;
                }
              }
            }
            else {
              local_a0 = (pFVar5->top).plane;
              *planestocheck = *planestocheck & 0xfffffffd;
            }
            if (dVar15 <= dVar14) {
              return false;
            }
          }
        }
      }
    }
    this->lastsector = (sector_t *)0x0;
    this->lastceilingplane = local_a8;
    this->lastfloorplane = local_a0;
  }
  return true;
}

Assistant:

bool AimTraverse3DFloors(const divline_t &trace, intercept_t * in, int frontflag, int *planestocheck)
	{
		sector_t * nextsector;
		secplane_t * nexttopplane, *nextbottomplane;
		line_t * li = in->d.line;

		nextsector = NULL;
		nexttopplane = nextbottomplane = NULL;
		*planestocheck = aimdir;

		if (li->backsector == NULL) return true;	// shouldn't really happen but crashed once for me...
		if (li->frontsector->e->XFloor.ffloors.Size() || li->backsector->e->XFloor.ffloors.Size())
		{
			F3DFloor* rover;
			DAngle highpitch, lowpitch;

			double trX = trace.x + trace.dx * in->frac;
			double trY = trace.y + trace.dy * in->frac;
			double dist = attackrange * in->frac;

			// 3D floor check. This is not 100% accurate but normally sufficient when
			// combined with a final sight check
			for (int i = 1; i <= 2; i++)
			{
				sector_t * s = i == 1 ? li->frontsector : li->backsector;

				for (unsigned k = 0; k < s->e->XFloor.ffloors.Size(); k++)
				{
					crossedffloors = true;
					rover = s->e->XFloor.ffloors[k];

					if ((rover->flags & FF_SHOOTTHROUGH) || !(rover->flags & FF_EXISTS)) continue;

					double ff_bottom = rover->bottom.plane->ZatPoint(trX, trY);
					double ff_top = rover->top.plane->ZatPoint(trX, trY);


					highpitch = -VecToAngle(dist, ff_top - shootz);
					lowpitch = -VecToAngle(dist, ff_bottom - shootz);

					if (highpitch <= toppitch)
					{
						// blocks completely
						if (lowpitch >= bottompitch) return false;
						// blocks upper edge of view
						if (lowpitch > toppitch)
						{
							toppitch = lowpitch;
							if (frontflag != i - 1)
							{
								nexttopplane = rover->bottom.plane;
								*planestocheck &= ~aim_up;
							}
						}
					}
					else if (lowpitch >= bottompitch)
					{
						// blocks lower edge of view
						if (highpitch < bottompitch)
						{
							bottompitch = highpitch;
							if (frontflag != i - 1)
							{
								nextbottomplane = rover->top.plane;
								*planestocheck &= ~aim_down;
							}
						}
					}
					// trace is leaving a sector with a 3d-floor

					if (frontflag == i - 1)
					{
						if (s == lastsector)
						{
							// upper slope intersects with this 3d-floor
							if (rover->bottom.plane == lastceilingplane && lowpitch > toppitch)
							{
								toppitch = lowpitch;
							}
							// lower slope intersects with this 3d-floor
							if (rover->top.plane == lastfloorplane && highpitch < bottompitch)
							{
								bottompitch = highpitch;
							}
						}
					}
					if (toppitch >= bottompitch) return false;		// stop
				}
			}
		}

		lastsector = nextsector;
		lastceilingplane = nexttopplane;
		lastfloorplane = nextbottomplane;
		return true;
	}